

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionUpvalueClose
          (ExpressionContext *ctx,SynBase *source,FunctionData *onwerFunction,ScopeData *fromScope)

{
  Lexeme *allocator;
  TypeBase *type;
  ScopeData *pSVar1;
  FunctionData *source_00;
  ExpressionContext *this;
  CloseUpvaluesData *this_00;
  ArrayView<ExprBase_*> arr;
  undefined1 local_48 [12];
  ExpressionContext *local_38;
  ExprSequence *holder;
  ScopeData *fromScope_local;
  FunctionData *onwerFunction_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (onwerFunction == (FunctionData *)0x0) {
    ctx_local = (ExpressionContext *)0x0;
  }
  else {
    holder = (ExprSequence *)fromScope;
    fromScope_local = (ScopeData *)onwerFunction;
    onwerFunction_local = (FunctionData *)source;
    source_local = (SynBase *)ctx;
    this = (ExpressionContext *)ExpressionContext::get<ExprSequence>(ctx);
    source_00 = onwerFunction_local;
    allocator = source_local[0x229].begin;
    type = *(TypeBase **)&source_local[0x226].listed;
    ArrayView<ExprBase_*>::ArrayView((ArrayView<ExprBase_*> *)local_48);
    arr._12_4_ = 0;
    arr.data = (ExprBase **)local_48._0_8_;
    arr.count = local_48._8_4_;
    ExprSequence::ExprSequence
              ((ExprSequence *)this,(Allocator *)allocator,(SynBase *)source_00,type,arr);
    pSVar1 = fromScope_local + 1;
    local_38 = this;
    this_00 = ExpressionContext::get<CloseUpvaluesData>((ExpressionContext *)source_local);
    CloseUpvaluesData::CloseUpvaluesData
              (this_00,(ExprSequence *)local_38,CLOSE_UPVALUES_FUNCTION,
               (SynBase *)onwerFunction_local,(ScopeData *)holder,0);
    IntrusiveList<CloseUpvaluesData>::push_back
              ((IntrusiveList<CloseUpvaluesData> *)&(pSVar1->allVariables).allocator,this_00);
    ctx_local = local_38;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateFunctionUpvalueClose(ExpressionContext &ctx, SynBase *source, FunctionData *onwerFunction, ScopeData *fromScope)
{
	if(!onwerFunction)
		return NULL;

	ExprSequence *holder = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, ctx.typeVoid, ArrayView<ExprBase*>());

	onwerFunction->closeUpvalues.push_back(new (ctx.get<CloseUpvaluesData>()) CloseUpvaluesData(holder, CLOSE_UPVALUES_FUNCTION, source, fromScope, 0));

	return holder;
}